

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::MultipleBindingCase
          (MultipleBindingCase *this,Context *ctx,char *name,int flags)

{
  ushort uVar1;
  char *local_1c8 [4];
  ostream local_1a8;
  
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_01e52a08;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"draw test pattern");
  if ((flags & 1U) != 0) {
    std::operator<<(&local_1a8,", zero stride");
  }
  if ((flags & 2U) != 0) {
    std::operator<<(&local_1a8,", instanced binding point");
  }
  if ((flags & 4U) != 0) {
    std::operator<<(&local_1a8,", binding points share buffer object");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  BindingRenderCase::BindingRenderCase(&this->super_BindingRenderCase,ctx,name,local_1c8[0],false);
  std::__cxx11::string::~string((string *)local_1c8);
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_01e52a08;
  (this->m_spec).aliasingBuffers = (bool)((byte)flags >> 2 & 1);
  uVar1 = (ushort)flags & 1 | (ushort)((byte)flags >> 1 & 1) << 8;
  (this->m_spec).zeroStride = (bool)(char)uVar1;
  (this->m_spec).instanced = (bool)(char)(uVar1 >> 8);
  this->m_primitiveBuf = 0;
  this->m_colorOffsetBuf = 0;
  return;
}

Assistant:

MultipleBindingCase::MultipleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), false)
	, m_spec			(genTestSpec(flags))
	, m_primitiveBuf	(0)
	, m_colorOffsetBuf	(0)
{
	DE_ASSERT(!(m_spec.instanced && m_spec.zeroStride));
}